

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O3

void __thiscall
CryptoUtil_EncodeBase58Check_Test::~CryptoUtil_EncodeBase58Check_Test
          (CryptoUtil_EncodeBase58Check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, EncodeBase58Check) {
  ByteData data(
      "0488b21e051431616f00000000e6ba4088246b104837c62bd01fd8ba1cf2931ad1a5376c2360a1f112f2cfc63c02acf89ab4e3daa79bceef2ebecee2af92712e6bf5e4b0d10c74bbecc27ac13da8");
  std::string result = CryptoUtil::EncodeBase58Check(data);
  EXPECT_STREQ(
      result.c_str(),
      "xpub6FZeZ5vwcYiT6r7ZYKJhyUqBxMBvzSmb6SpPQCsSenGPrVjKk5SGW4JJpc7cKERN8w9KnJZcMgJA4B2cHnpGq5TahYrDvZSBY2EMLKPRMTT");
}